

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O2

void bcwrite_ktabk(BCWriteCtx *ctx,cTValue *o,int narrow)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  char *pcVar5;
  byte *pbVar6;
  uint32_t uVar7;
  
  uVar2 = (ctx->sb).p.ptr32;
  pbVar6 = (byte *)(ulong)uVar2;
  if ((ctx->sb).e.ptr32 - uVar2 < 0xb) {
    pbVar6 = (byte *)lj_buf_more2(&ctx->sb,0xb);
  }
  uVar2 = (o->field_2).it;
  if (uVar2 == 0xfffffffb) {
    uVar2 = (o->u32).lo;
    uVar3 = *(uint *)((ulong)uVar2 + 0xc);
    uVar7 = uVar3 + 5;
    uVar4 = (ctx->sb).p.ptr32;
    pcVar5 = (char *)(ulong)uVar4;
    if ((ctx->sb).e.ptr32 - uVar4 < uVar7) {
      pcVar5 = lj_buf_more2(&ctx->sb,uVar7);
    }
    pcVar5 = lj_strfmt_wuleb128(pcVar5,uVar7);
    memcpy(pcVar5,(void *)((ulong)uVar2 + 0x10),(ulong)uVar3);
    uVar7 = (int)pcVar5 + uVar3;
    goto LAB_0012689c;
  }
  if (0xfffefffe < uVar2) {
    *pbVar6 = ~(byte)uVar2;
    uVar7 = (int)pbVar6 + 1;
    goto LAB_0012689c;
  }
  if (narrow == 0) {
LAB_00126861:
    *pbVar6 = 4;
    pbVar6 = (byte *)lj_strfmt_wuleb128((char *)(pbVar6 + 1),(o->u32).lo);
    uVar7 = (o->field_2).it;
  }
  else {
    dVar1 = o->n;
    if ((dVar1 != (double)(int)dVar1) || (NAN(dVar1) || NAN((double)(int)dVar1))) goto LAB_00126861;
    uVar7 = (uint32_t)dVar1;
    *pbVar6 = 3;
    pbVar6 = pbVar6 + 1;
  }
  pcVar5 = lj_strfmt_wuleb128((char *)pbVar6,uVar7);
  uVar7 = (uint32_t)pcVar5;
LAB_0012689c:
  (ctx->sb).p.ptr32 = uVar7;
  return;
}

Assistant:

static void bcwrite_ktabk(BCWriteCtx *ctx, cTValue *o, int narrow)
{
  char *p = lj_buf_more(&ctx->sb, 1+10);
  if (tvisstr(o)) {
    const GCstr *str = strV(o);
    MSize len = str->len;
    p = lj_buf_more(&ctx->sb, 5+len);
    p = lj_strfmt_wuleb128(p, BCDUMP_KTAB_STR+len);
    p = lj_buf_wmem(p, strdata(str), len);
  } else if (tvisint(o)) {
    *p++ = BCDUMP_KTAB_INT;
    p = lj_strfmt_wuleb128(p, intV(o));
  } else if (tvisnum(o)) {
    if (!LJ_DUALNUM && narrow) {  /* Narrow number constants to integers. */
      lua_Number num = numV(o);
      int32_t k = lj_num2int(num);
      if (num == (lua_Number)k) {  /* -0 is never a constant. */
	*p++ = BCDUMP_KTAB_INT;
	p = lj_strfmt_wuleb128(p, k);
	setsbufP(&ctx->sb, p);
	return;
      }
    }
    *p++ = BCDUMP_KTAB_NUM;
    p = lj_strfmt_wuleb128(p, o->u32.lo);
    p = lj_strfmt_wuleb128(p, o->u32.hi);
  } else {
    lj_assertBCW(tvispri(o), "unhandled type %d", itype(o));
    *p++ = BCDUMP_KTAB_NIL+~itype(o);
  }
  setsbufP(&ctx->sb, p);
}